

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::repeat_at_least::name_abi_cxx11_(repeat_at_least *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  
  __lhs = in_RDI;
  CLI::std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  scanner_storage::name_abi_cxx11_((scanner_storage *)__lhs);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return (string *)__lhs;
}

Assistant:

TOML11_INLINE std::string repeat_at_least::name() const
{
    return "repeat_at_least{" + std::to_string(length_) + ", " + other_.name() + "}";
}